

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Gia_ManBmcAddCnf(Bmc_Mna_t *p,Gia_Man_t *pGia,Vec_Int_t *vIns,Vec_Int_t *vNodes,
                     Vec_Int_t *vOuts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  Aig_Man_t *p_01;
  Cnf_Dat_t *p_02;
  Vec_Int_t *pVVar4;
  int *pMap;
  bool bVar5;
  int local_68;
  int VarC0;
  int iObj;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vMap;
  Vec_Int_t *vUsed;
  Cnf_Dat_t *pCnf;
  Aig_Man_t *pAig;
  Gia_Man_t *pNew;
  Vec_Int_t *vOuts_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vIns_local;
  Gia_Man_t *pGia_local;
  Bmc_Mna_t *p_local;
  
  p_00 = Gia_ManBmcDupCone(pGia,vIns,vNodes,vOuts);
  p_01 = Gia_ManToAigSimple(p_00);
  iVar1 = Aig_ManCoNum(p_01);
  p_02 = Cnf_Derive(p_01,iVar1);
  iVar1 = p_02->nVars;
  iVar2 = Vec_IntSize(vIns);
  iVar3 = Vec_IntSize(vOuts);
  pVVar4 = Vec_IntAlloc((iVar1 - iVar2) - iVar3);
  VarC0 = 0;
  while( true ) {
    bVar5 = false;
    if (VarC0 < p_00->nObjs) {
      _iObj = Gia_ManObj(p_00,VarC0);
      bVar5 = _iObj != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_iObj);
    if ((iVar1 != 0) && (-1 < p_02->pVarNums[VarC0])) {
      iVar1 = Vec_IntSize(vIns);
      iVar1 = Vec_IntEntry(vNodes,(VarC0 - iVar1) + -1);
      Vec_IntPush(pVVar4,iVar1);
    }
    VarC0 = VarC0 + 1;
  }
  iVar1 = Gia_ManBmcAssignVarIds(p,vIns,pVVar4,vOuts);
  Vec_IntFree(pVVar4);
  pVVar4 = Vec_IntStartFull(p_02->nVars);
  if (*p_02->pVarNums < 1) {
    __assert_fail("pCnf->pVarNums[0] > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                  ,0x206,
                  "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Vec_IntWriteEntry(pVVar4,*p_02->pVarNums,iVar1);
  VarC0 = 1;
  do {
    bVar5 = false;
    if (VarC0 < p_00->nObjs) {
      _iObj = Gia_ManObj(p_00,VarC0);
      bVar5 = _iObj != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) {
      VarC0 = 0;
      while( true ) {
        if (p_02->nLiterals <= VarC0) {
          Vec_IntFree(pVVar4);
          VarC0 = 0;
          while ((VarC0 < p_02->nClauses &&
                 (iVar1 = sat_solver_addclause
                                    (p->pSat,p_02->pClauses[VarC0],p_02->pClauses[VarC0 + 1]),
                 iVar1 != 0))) {
            VarC0 = VarC0 + 1;
          }
          if (VarC0 < p_02->nClauses) {
            printf("SAT solver became UNSAT after adding clauses.\n");
          }
          Aig_ManStop(p_01);
          Cnf_DataFree(p_02);
          Gia_ManStop(p_00);
          return;
        }
        if (((*p_02->pClauses)[VarC0] < 2) ||
           (SBORROW4((*p_02->pClauses)[VarC0],p_02->nVars * 2) ==
            (*p_02->pClauses)[VarC0] + p_02->nVars * -2 < 0)) break;
        pMap = Vec_IntArray(pVVar4);
        iVar1 = Abc_Lit2LitV(pMap,(*p_02->pClauses)[VarC0]);
        (*p_02->pClauses)[VarC0] = iVar1;
        VarC0 = VarC0 + 1;
      }
      __assert_fail("pCnf->pClauses[0][i] > 1 && pCnf->pClauses[0][i] < 2 * pCnf->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                    ,0x21b,
                    "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (-1 < p_02->pVarNums[VarC0]) {
      if ((p_02->pVarNums[VarC0] < 0) || (p_02->nVars <= p_02->pVarNums[VarC0])) {
        __assert_fail("pCnf->pVarNums[i] >= 0 && pCnf->pVarNums[i] < pCnf->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                      ,0x20c,
                      "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = Gia_ObjIsCi(_iObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(_iObj);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCo(_iObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                          ,0x213,
                          "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar1 = Vec_IntSize(vIns);
          iVar2 = Vec_IntSize(vNodes);
          local_68 = Vec_IntEntry(vOuts,((VarC0 - iVar1) - iVar2) + -1);
        }
        else {
          iVar1 = Vec_IntSize(vIns);
          local_68 = Vec_IntEntry(vNodes,(VarC0 - iVar1) + -1);
        }
      }
      else {
        local_68 = Vec_IntEntry(vIns,VarC0 + -1);
      }
      iVar1 = Vec_IntEntry(p->vId2Var,local_68);
      if (iVar1 < 1) {
        __assert_fail("Vec_IntEntry(p->vId2Var, iObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                      ,0x214,
                      "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = p_02->pVarNums[VarC0];
      iVar2 = Vec_IntEntry(p->vId2Var,local_68);
      Vec_IntWriteEntry(pVVar4,iVar1,iVar2);
    }
    VarC0 = VarC0 + 1;
  } while( true );
}

Assistant:

void Gia_ManBmcAddCnf( Bmc_Mna_t * p, Gia_Man_t * pGia, Vec_Int_t * vIns, Vec_Int_t * vNodes, Vec_Int_t * vOuts )
{
    Gia_Man_t * pNew = Gia_ManBmcDupCone( pGia, vIns, vNodes, vOuts );
    Aig_Man_t * pAig = Gia_ManToAigSimple( pNew );
    Cnf_Dat_t * pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Vec_Int_t * vUsed, * vMap;
    Gia_Obj_t * pObj;
    int i, iObj, VarC0;
    // collect used variables
    vUsed = Vec_IntAlloc( pCnf->nVars - Vec_IntSize(vIns) - Vec_IntSize(vOuts) );
    Gia_ManForEachAnd( pNew, pObj, i )
        if ( pCnf->pVarNums[i] >= 0 )
            Vec_IntPush( vUsed, Vec_IntEntry(vNodes, i - Vec_IntSize(vIns) - 1) );
    // assign variable IDs
    VarC0 = Gia_ManBmcAssignVarIds( p, vIns, vUsed, vOuts );
    Vec_IntFree( vUsed );
    // create variable map from CNF vars into SAT vars
    vMap = Vec_IntStartFull( pCnf->nVars );
    assert( pCnf->pVarNums[0] > 0 );
    Vec_IntWriteEntry( vMap, pCnf->pVarNums[0], VarC0 );
    Gia_ManForEachObj1( pNew, pObj, i )
    {
        if ( pCnf->pVarNums[i] < 0 )
            continue;
        assert( pCnf->pVarNums[i] >= 0 && pCnf->pVarNums[i] < pCnf->nVars );
        if ( Gia_ObjIsCi(pObj) )
            iObj = Vec_IntEntry( vIns, i - 1 );
        else if ( Gia_ObjIsAnd(pObj) )
            iObj = Vec_IntEntry( vNodes, i - Vec_IntSize(vIns) - 1 );
        else if ( Gia_ObjIsCo(pObj) )
            iObj = Vec_IntEntry( vOuts, i - Vec_IntSize(vIns) - Vec_IntSize(vNodes) - 1 );
        else assert( 0 );
        assert( Vec_IntEntry(p->vId2Var, iObj) > 0 );
        Vec_IntWriteEntry( vMap, pCnf->pVarNums[i], Vec_IntEntry(p->vId2Var, iObj) );
    }
//Vec_IntPrint( vMap );
    // remap CNF
    for ( i = 0; i < pCnf->nLiterals; i++ )
    {
        assert( pCnf->pClauses[0][i] > 1 && pCnf->pClauses[0][i] < 2 * pCnf->nVars );
        pCnf->pClauses[0][i] = Abc_Lit2LitV( Vec_IntArray(vMap), pCnf->pClauses[0][i] );
    }
    Vec_IntFree( vMap );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
/*
        int v;
        for ( v = 0; v < pCnf->pClauses[i+1] - pCnf->pClauses[i]; v++ )
            printf( "%d ", pCnf->pClauses[i][v] );
        printf( "\n" );
*/
        if ( !sat_solver_addclause( p->pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            break;
    }
    if ( i < pCnf->nClauses )
        printf( "SAT solver became UNSAT after adding clauses.\n" );
    Aig_ManStop( pAig );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pNew );
}